

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::moveAppend
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,Command *e)

{
  Command *pCVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  TypedName *pTVar6;
  qsizetype qVar7;
  
  if ((b != e) && (b < e)) {
    pCVar1 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
    qVar7 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
    do {
      pDVar2 = (b->cmd).name.d.d;
      (b->cmd).name.d.d = (Data *)0x0;
      pCVar1[qVar7].cmd.name.d.d = pDVar2;
      pcVar3 = (b->cmd).name.d.ptr;
      (b->cmd).name.d.ptr = (char16_t *)0x0;
      pCVar1[qVar7].cmd.name.d.ptr = pcVar3;
      qVar4 = (b->cmd).name.d.size;
      (b->cmd).name.d.size = 0;
      pCVar1[qVar7].cmd.name.d.size = qVar4;
      pDVar2 = (b->cmd).type.d.d;
      (b->cmd).type.d.d = (Data *)0x0;
      pCVar1[qVar7].cmd.type.d.d = pDVar2;
      pcVar3 = (b->cmd).type.d.ptr;
      (b->cmd).type.d.ptr = (char16_t *)0x0;
      pCVar1[qVar7].cmd.type.d.ptr = pcVar3;
      qVar4 = (b->cmd).type.d.size;
      (b->cmd).type.d.size = 0;
      pCVar1[qVar7].cmd.type.d.size = qVar4;
      pDVar2 = (b->cmd).typeSuffix.d.d;
      (b->cmd).typeSuffix.d.d = (Data *)0x0;
      pCVar1[qVar7].cmd.typeSuffix.d.d = pDVar2;
      pcVar3 = (b->cmd).typeSuffix.d.ptr;
      (b->cmd).typeSuffix.d.ptr = (char16_t *)0x0;
      pCVar1[qVar7].cmd.typeSuffix.d.ptr = pcVar3;
      qVar4 = (b->cmd).typeSuffix.d.size;
      (b->cmd).typeSuffix.d.size = 0;
      pCVar1[qVar7].cmd.typeSuffix.d.size = qVar4;
      pDVar5 = (b->args).d.d;
      (b->args).d.d = (Data *)0x0;
      pCVar1[qVar7].args.d.d = pDVar5;
      pTVar6 = (b->args).d.ptr;
      (b->args).d.ptr = (TypedName *)0x0;
      pCVar1[qVar7].args.d.ptr = pTVar6;
      qVar4 = (b->args).d.size;
      (b->args).d.size = 0;
      pCVar1[qVar7].args.d.size = qVar4;
      pCVar1[qVar7].deviceLevel = b->deviceLevel;
      b = b + 1;
      qVar7 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size + 1;
      (this->super_QArrayDataPointer<VkSpecParser::Command>).size = qVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }